

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

ComponentHandle<A,_entityx::EntityManager> __thiscall
entityx::EntityManager::component<A,void>(EntityManager *this,Id id)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  reference ppBVar4;
  EntityManager *this_00;
  int __c;
  Id in_RSI;
  EntityManager *in_RDI;
  BasePool *pool;
  size_t family;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte local_69;
  reference local_48;
  value_type local_38;
  char *local_30;
  Id local_18;
  ComponentHandle<A,_entityx::EntityManager> local_10;
  
  local_18.id_ = in_RSI.id_;
  assert_valid(in_RDI,in_RSI);
  pcVar2 = (char *)component_family<A>();
  local_30 = pcVar2;
  pcVar3 = (char *)Catch::clara::std::
                   vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::size
                             ((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                              (in_RDI + 0x18));
  if (pcVar2 < pcVar3) {
    pcVar2 = local_30;
    ppBVar4 = Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::
              operator[]((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                         (in_RDI + 0x18),(size_type)local_30);
    local_38 = *ppBVar4;
    local_69 = 1;
    if (local_38 != (value_type)0x0) {
      this_00 = in_RDI + 0x48;
      pcVar2 = Entity::Id::index(&local_18,pcVar2,__c);
      Catch::clara::std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::operator[]
                ((vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)this_00,
                 (ulong)pcVar2 & 0xffffffff);
      Catch::clara::std::bitset<64UL>::operator[]
                ((bitset<64UL> *)this_00,
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      bVar1 = std::bitset::reference::operator_cast_to_bool
                        ((reference *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80))
      ;
      local_69 = bVar1 ^ 0xff;
      Catch::clara::std::bitset<64UL>::reference::~reference(&local_48);
    }
    if ((local_69 & 1) == 0) {
      ComponentHandle<A,_entityx::EntityManager>::ComponentHandle(&local_10,in_RDI,local_18);
    }
    else {
      ComponentHandle<A,_entityx::EntityManager>::ComponentHandle
                ((ComponentHandle<A,_entityx::EntityManager> *)0x2c0d7a);
    }
  }
  else {
    ComponentHandle<A,_entityx::EntityManager>::ComponentHandle
              ((ComponentHandle<A,_entityx::EntityManager> *)0x2c0cc8);
  }
  return local_10;
}

Assistant:

ComponentHandle<C> component(Entity::Id id) {
    assert_valid(id);
    size_t family = component_family<C>();
    // We don't bother checking the component mask, as we return a nullptr anyway.
    if (family >= component_pools_.size())
      return ComponentHandle<C>();
    BasePool *pool = component_pools_[family];
    if (!pool || !entity_component_mask_[id.index()][family])
      return ComponentHandle<C>();
    return ComponentHandle<C>(this, id);
  }